

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int AF_AActor_Touch(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret
                   ,int numret)

{
  PClass *pPVar1;
  PClass *pPVar2;
  long *plVar3;
  char *pcVar4;
  undefined8 *puVar5;
  bool bVar6;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_0042d923;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0042d90a:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0042d923:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x5d3,"int AF_AActor_Touch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  plVar3 = (long *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (plVar3 == (long *)0x0) goto LAB_0042d850;
    pPVar1 = (PClass *)plVar3[1];
    if (pPVar1 == (PClass *)0x0) {
      pPVar1 = (PClass *)(**(code **)*plVar3)(plVar3);
      plVar3[1] = (long)pPVar1;
    }
    bVar6 = pPVar1 != (PClass *)0x0;
    if (pPVar1 != pPVar2 && bVar6) {
      do {
        pPVar1 = pPVar1->ParentClass;
        bVar6 = pPVar1 != (PClass *)0x0;
        if (pPVar1 == pPVar2) break;
      } while (pPVar1 != (PClass *)0x0);
    }
    if (!bVar6) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0042d923;
    }
  }
  else {
    if (plVar3 != (long *)0x0) goto LAB_0042d90a;
LAB_0042d850:
    plVar3 = (long *)0x0;
  }
  if (numparam == 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_0042d942;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_0042d913:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_0042d942;
  }
  puVar5 = (undefined8 *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (puVar5 == (undefined8 *)0x0) goto LAB_0042d881;
  }
  else {
    if (puVar5 != (undefined8 *)0x0) goto LAB_0042d913;
LAB_0042d881:
    NullParam("\"toucher\"");
    puVar5 = (undefined8 *)param[1].field_0.field_1.a;
    if (puVar5 == (undefined8 *)0x0) {
      puVar5 = (undefined8 *)0x0;
      goto LAB_0042d8ee;
    }
  }
  pPVar1 = AActor::RegistrationInfo.MyClass;
  pPVar2 = (PClass *)puVar5[1];
  if (pPVar2 == (PClass *)0x0) {
    pPVar2 = (PClass *)(**(code **)*puVar5)(puVar5);
    puVar5[1] = pPVar2;
  }
  bVar6 = pPVar2 != (PClass *)0x0;
  if (pPVar2 != pPVar1 && bVar6) {
    do {
      pPVar2 = pPVar2->ParentClass;
      bVar6 = pPVar2 != (PClass *)0x0;
      if (pPVar2 == pPVar1) break;
    } while (pPVar2 != (PClass *)0x0);
  }
  if (!bVar6) {
    pcVar4 = "toucher == NULL || toucher->IsKindOf(RUNTIME_CLASS(AActor))";
LAB_0042d942:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x5d4,"int AF_AActor_Touch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_0042d8ee:
  (**(code **)(*plVar3 + 0x98))(plVar3,puVar5);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, Touch)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT_NOT_NULL(toucher, AActor);
	self->Touch(toucher);
	return 0;
}